

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_encoding.h
# Opt level: O1

void ximu::PacketEncoding::
     encodePacket<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                src,size_t count,
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               dest)

{
  uint uVar1;
  ulong uVar2;
  ulong __n;
  unsigned_long __n2;
  undefined1 local_70 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> encodedPacket;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> shiftRegister;
  
  if (count != 0) {
    encodedPacket.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)dest.container;
    uVar1 = encodedPacketSize((uint)count);
    __n = (ulong)uVar1;
    local_50[0] = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,__n,local_50,
               (allocator_type *)
               ((long)&shiftRegister.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    shiftRegister.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,__n,
               (value_type *)
               ((long)&shiftRegister.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7),
               (allocator_type *)
               ((long)&shiftRegister.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 6));
    memmove((void *)CONCAT71(local_50._1_7_,local_50[0]),src._M_current,count);
    if (__n != 0) {
      uVar2 = 0;
      do {
        rightShiftBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
        *(uchar *)((long)local_70 + uVar2) =
             *(uchar *)(CONCAT71(local_50._1_7_,local_50[0]) + uVar2);
        *(undefined1 *)(CONCAT71(local_50._1_7_,local_50[0]) + uVar2) = 0;
        uVar2 = uVar2 + 1;
      } while (__n != uVar2);
    }
    encodedPacket.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[-1] =
         encodedPacket.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[-1] | 0x80;
    if (__n != 0) {
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((uchar *)local_70,(uchar *)((long)local_70 + __n),
                 (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
                 encodedPacket.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if ((void *)CONCAT71(local_50._1_7_,local_50[0]) != (void *)0x0) {
      operator_delete((void *)CONCAT71(local_50._1_7_,local_50[0]));
    }
    if (local_70 != (undefined1  [8])0x0) {
      operator_delete((void *)local_70);
    }
  }
  return;
}

Assistant:

static void encodePacket(InputIterator src, size_t count,
                           OutputIterator dest) {
    // need at least one byte to encode 
    if (count < 1)
      return;

    // calculate new message length
    unsigned encodedLength = encodedPacketSize(count);
    std::vector<unsigned char> encodedPacket(encodedLength, 0);
    std::vector<unsigned char> shiftRegister(encodedLength, 0);
    
    // fill the shift register
    std::copy_n(src, count, shiftRegister.begin());

    // shift
    for (unsigned idx = 0; idx != encodedLength; ++idx) {
      rightShiftBytes(shiftRegister);           // r-shift clear msb i
      encodedPacket[idx] = shiftRegister[idx];  // store encoded byte
      shiftRegister[idx] = 0;                   // clear byte from sr
    }
    // set msb of framing byte
    encodedPacket.back() |= 0x80;
    std::copy_n(encodedPacket.begin(), encodedLength, dest);
  }